

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O3

void __thiscall
Disa::Adjacency_Graph<false>::Adjacency_Graph
          (Adjacency_Graph<false> *this,
          initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph)

{
  ulong uVar1;
  Edge *pEVar2;
  Edge *pEVar3;
  ulong uVar4;
  unsigned_long uVar5;
  Edge *edge;
  Edge *pEVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  const_iterator __begin2;
  
  uVar4 = edge_graph._M_len;
  edge = edge_graph._M_array;
  uVar9 = uVar4 * 0x10;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar6 = edge;
  if (1 < uVar4) {
    pEVar3 = edge + 1;
    uVar5 = edge->first;
    do {
      uVar7 = pEVar6->second;
      if (pEVar6->second < uVar5) {
        uVar7 = uVar5;
      }
      uVar1 = pEVar3->first;
      uVar8 = pEVar3->second;
      if (pEVar3->second < uVar1) {
        uVar8 = uVar1;
      }
      pEVar2 = pEVar3;
      if (uVar8 <= uVar7) {
        pEVar2 = pEVar6;
        uVar1 = uVar5;
      }
      uVar5 = uVar1;
      pEVar6 = pEVar2;
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != edge + uVar4);
  }
  uVar7 = pEVar6->second;
  if (pEVar6->second < pEVar6->first) {
    uVar7 = pEVar6->first;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&this->offset,uVar7 + 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->vertex_adjacent_list,uVar4 * 2);
  while (uVar4 != 0) {
    insert(this,edge);
    edge = edge + 1;
    uVar9 = uVar9 - 0x10;
    uVar4 = uVar9;
  }
  if ((this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
    _S_do_it(&this->vertex_adjacent_list);
  }
  if ((this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage ==
      (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
  _S_do_it(&this->offset);
  return;
}

Assistant:

Adjacency_Graph<_directed>::Adjacency_Graph(std::initializer_list<Edge> edge_graph) {
  const auto iter = std::max_element(edge_graph.begin(), edge_graph.end(),
                                     !_directed ?
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return order_edge_vertex(&edge_0).second < order_edge_vertex(&edge_1).second;
                                        } :
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return edge_0.second < edge_1.second;
                                        });
  reserve(!_directed ? std::max(iter->first, iter->second) : iter->first, edge_graph.size());
  FOR_EACH(edge, edge_graph) insert(edge);
  shrink_to_fit();
}